

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall DirectionCone_UnionRandoms_Test::TestBody(DirectionCone_UnionRandoms_Test *this)

{
  Vector3f w;
  Message *pMVar1;
  DirectionCone *d;
  char *in_R9;
  int iVar2;
  bool bVar3;
  undefined1 extraout_var [56];
  undefined1 auVar5 [56];
  Vector3f VVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  Tuple3<pbrt::Vector3,_float> local_d0;
  int local_c0;
  float local_bc;
  AssertionResult gtest_ar_;
  AssertHelper local_a8;
  float local_a0;
  float fStack_9c;
  DirectionCone c;
  DirectionCone b;
  RNG rng;
  DirectionCone a;
  undefined1 auVar4 [64];
  
  pbrt::RNG::SetSequence(&rng,0x10);
  local_c0 = 0;
  do {
    if (local_c0 == 100) {
      return;
    }
    RandomCone(&a,&rng);
    RandomCone(&b,&rng);
    d = &a;
    pbrt::Union(&c,&a,&b);
    iVar2 = 100;
LAB_0036b94e:
    bVar3 = iVar2 != 0;
    iVar2 = iVar2 + -1;
    if (bVar3) {
      local_bc = pbrt::RNG::Uniform<float>(&rng);
      fStack_9c = pbrt::RNG::Uniform<float>(&rng);
      local_a0 = local_bc;
      auVar5 = extraout_var;
      VVar6 = pbrt::SampleUniformSphere((Point2f *)&local_a0);
      local_d0.z = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar4._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar4._8_56_ = auVar5;
      local_d0._0_8_ = vmovlps_avx(auVar4._0_16_);
      bVar3 = pbrt::Inside((pbrt *)&a,d,VVar6);
      if (!bVar3) break;
      goto LAB_0036b9ba;
    }
    local_c0 = local_c0 + 1;
  } while( true );
  VVar6.super_Tuple3<pbrt::Vector3,_float>.z = local_d0.z;
  VVar6.super_Tuple3<pbrt::Vector3,_float>.x = local_d0.x;
  VVar6.super_Tuple3<pbrt::Vector3,_float>.y = local_d0.y;
  bVar3 = pbrt::Inside((pbrt *)&b,d,VVar6);
  if (bVar3) {
LAB_0036b9ba:
    w.super_Tuple3<pbrt::Vector3,_float>.z = local_d0.z;
    w.super_Tuple3<pbrt::Vector3,_float>.x = local_d0.x;
    w.super_Tuple3<pbrt::Vector3,_float>.y = local_d0.y;
    gtest_ar_.success_ = pbrt::Inside((pbrt *)&c,d,w);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_d8);
      std::operator<<((ostream *)(local_d8.ptr_ + 0x10),"a: ");
      pMVar1 = testing::Message::operator<<((Message *)&local_d8,&a);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [6])", b: ");
      pMVar1 = testing::Message::operator<<(pMVar1,&b);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [10])", union: ");
      pMVar1 = testing::Message::operator<<(pMVar1,&c);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [6])", w: ");
      d = (DirectionCone *)testing::Message::operator<<(pMVar1,(Vector3<float> *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_a0,(internal *)&gtest_ar_,(AssertionResult *)"Inside(c, w)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0x182,(char *)CONCAT44(fStack_9c,local_a0));
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)d);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)&local_a0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_d8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  goto LAB_0036b94e;
}

Assistant:

TEST(DirectionCone, UnionRandoms) {
    RNG rng(16);

    for (int i = 0; i < 100; ++i) {
        DirectionCone a = RandomCone(rng), b = RandomCone(rng);
        DirectionCone c = Union(a, b);

        for (int j = 0; j < 100; ++j) {
            Vector3f w =
                SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
            if (Inside(a, w) || Inside(b, w))
                EXPECT_TRUE(Inside(c, w))
                    << "a: " << a << ", b: " << b << ", union: " << c << ", w: " << w;
        }
    }
}